

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

_variable_type __thiscall
gl4cts::FunctionObject::tenaryBase::getArgumentType(tenaryBase *this,GLuint argument)

{
  GLuint argument_local;
  tenaryBase *this_local;
  
  if (argument == 0) {
    this_local._4_4_ = *(_variable_type *)&(this->super_functionObject).field_0x24;
  }
  else if (argument == 1) {
    this_local._4_4_ = this->m_arg_2_type;
  }
  else if (argument == 2) {
    this_local._4_4_ = this->m_arg_3_type;
  }
  else {
    this_local._4_4_ = VARIABLE_TYPE_UNKNOWN;
  }
  return this_local._4_4_;
}

Assistant:

virtual Utils::_variable_type getArgumentType(glw::GLuint argument) const
	{
		switch (argument)
		{
		case 0:
			return m_arg_1_type;
			break;
		case 1:
			return m_arg_2_type;
			break;
		case 2:
			return m_arg_3_type;
			break;
		default:
			return Utils::VARIABLE_TYPE_UNKNOWN;
			break;
		}
	}